

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_check_poc_val
                   (opj_poc_t *p_pocs,OPJ_UINT32 p_nb_pocs,OPJ_UINT32 p_nb_resolutions,
                   OPJ_UINT32 p_num_comps,OPJ_UINT32 p_num_layers,opj_event_mgr_t *p_manager)

{
  bool bVar1;
  int iVar2;
  void *ptr;
  uint local_78;
  uint local_74;
  int local_70;
  OPJ_UINT32 comp_index_1;
  OPJ_UINT32 res_index_1;
  OPJ_UINT32 l_last_layno1;
  OPJ_UINT32 comp_index;
  OPJ_UINT32 res_index;
  OPJ_UINT32 layno0;
  OPJ_BOOL loss;
  OPJ_UINT32 step_l;
  OPJ_UINT32 step_r;
  OPJ_UINT32 step_c;
  OPJ_UINT32 i;
  OPJ_UINT32 layno;
  OPJ_UINT32 compno;
  OPJ_UINT32 resno;
  OPJ_UINT32 index;
  OPJ_UINT32 *packet_array;
  opj_event_mgr_t *p_manager_local;
  OPJ_UINT32 p_num_layers_local;
  OPJ_UINT32 p_num_comps_local;
  OPJ_UINT32 p_nb_resolutions_local;
  OPJ_UINT32 p_nb_pocs_local;
  opj_poc_t *p_pocs_local;
  
  iVar2 = p_nb_resolutions * p_num_comps;
  bVar1 = false;
  ptr = opj_calloc((ulong)(iVar2 * p_num_layers),4);
  if (ptr == (void *)0x0) {
    opj_event_msg(p_manager,1,"Not enough memory for checking the poc values.\n");
    p_pocs_local._4_4_ = 0;
  }
  else if (p_nb_pocs == 0) {
    opj_free(ptr);
    p_pocs_local._4_4_ = 1;
  }
  else {
    compno = p_num_comps * p_pocs->resno0;
    for (layno = p_pocs->resno0; layno < p_pocs->resno1; layno = layno + 1) {
      l_last_layno1 = compno + p_pocs->compno0;
      for (i = p_pocs->compno0; i < p_pocs->compno1; i = i + 1) {
        res_index_1 = l_last_layno1;
        for (step_c = 0; step_c < p_pocs->layno1; step_c = step_c + 1) {
          *(undefined4 *)((long)ptr + (ulong)res_index_1 * 4) = 1;
          res_index_1 = iVar2 + res_index_1;
        }
        l_last_layno1 = l_last_layno1 + 1;
      }
      compno = p_num_comps + compno;
    }
    _p_nb_resolutions_local = p_pocs + 1;
    for (step_r = 1; step_r < p_nb_pocs; step_r = step_r + 1) {
      local_78 = _p_nb_resolutions_local[-1].layno1;
      if (_p_nb_resolutions_local->layno1 <= local_78) {
        local_78 = 0;
      }
      compno = p_num_comps * _p_nb_resolutions_local->resno0;
      for (layno = _p_nb_resolutions_local->resno0; layno < _p_nb_resolutions_local->resno1;
          layno = layno + 1) {
        local_70 = compno + _p_nb_resolutions_local->compno0;
        for (i = _p_nb_resolutions_local->compno0; i < _p_nb_resolutions_local->compno1; i = i + 1)
        {
          local_74 = local_70 + local_78 * iVar2;
          for (step_c = local_78; step_c < _p_nb_resolutions_local->layno1; step_c = step_c + 1) {
            *(undefined4 *)((long)ptr + (ulong)local_74 * 4) = 1;
            local_74 = iVar2 + local_74;
          }
          local_70 = local_70 + 1;
        }
        compno = p_num_comps + compno;
      }
      _p_nb_resolutions_local = _p_nb_resolutions_local + 1;
    }
    compno = 0;
    for (step_c = 0; step_c < p_num_layers; step_c = step_c + 1) {
      for (layno = 0; layno < p_nb_resolutions; layno = layno + 1) {
        for (i = 0; i < p_num_comps; i = i + 1) {
          bVar1 = (bool)(*(int *)((long)ptr + (ulong)compno * 4) != 1 | bVar1);
          compno = compno + 1;
        }
      }
    }
    if (bVar1) {
      opj_event_msg(p_manager,1,"Missing packets possible loss of data\n");
    }
    opj_free(ptr);
    p_pocs_local._4_4_ = (uint)((bVar1 ^ 0xffU) & 1);
  }
  return p_pocs_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_j2k_check_poc_val(const opj_poc_t *p_pocs,
                                      OPJ_UINT32 p_nb_pocs,
                                      OPJ_UINT32 p_nb_resolutions,
                                      OPJ_UINT32 p_num_comps,
                                      OPJ_UINT32 p_num_layers,
                                      opj_event_mgr_t * p_manager)
{
    OPJ_UINT32* packet_array;
    OPJ_UINT32 index, resno, compno, layno;
    OPJ_UINT32 i;
    OPJ_UINT32 step_c = 1;
    OPJ_UINT32 step_r = p_num_comps * step_c;
    OPJ_UINT32 step_l = p_nb_resolutions * step_r;
    OPJ_BOOL loss = OPJ_FALSE;
    OPJ_UINT32 layno0 = 0;

    packet_array = (OPJ_UINT32*) opj_calloc(step_l * p_num_layers,
                                            sizeof(OPJ_UINT32));
    if (packet_array == 00) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory for checking the poc values.\n");
        return OPJ_FALSE;
    }

    if (p_nb_pocs == 0) {
        opj_free(packet_array);
        return OPJ_TRUE;
    }

    index = step_r * p_pocs->resno0;
    /* take each resolution for each poc */
    for (resno = p_pocs->resno0 ; resno < p_pocs->resno1 ; ++resno) {
        OPJ_UINT32 res_index = index + p_pocs->compno0 * step_c;

        /* take each comp of each resolution for each poc */
        for (compno = p_pocs->compno0 ; compno < p_pocs->compno1 ; ++compno) {
            OPJ_UINT32 comp_index = res_index + layno0 * step_l;

            /* and finally take each layer of each res of ... */
            for (layno = layno0; layno < p_pocs->layno1 ; ++layno) {
                /*index = step_r * resno + step_c * compno + step_l * layno;*/
                packet_array[comp_index] = 1;
                comp_index += step_l;
            }

            res_index += step_c;
        }

        index += step_r;
    }
    ++p_pocs;

    /* iterate through all the pocs */
    for (i = 1; i < p_nb_pocs ; ++i) {
        OPJ_UINT32 l_last_layno1 = (p_pocs - 1)->layno1 ;

        layno0 = (p_pocs->layno1 > l_last_layno1) ? l_last_layno1 : 0;
        index = step_r * p_pocs->resno0;

        /* take each resolution for each poc */
        for (resno = p_pocs->resno0 ; resno < p_pocs->resno1 ; ++resno) {
            OPJ_UINT32 res_index = index + p_pocs->compno0 * step_c;

            /* take each comp of each resolution for each poc */
            for (compno = p_pocs->compno0 ; compno < p_pocs->compno1 ; ++compno) {
                OPJ_UINT32 comp_index = res_index + layno0 * step_l;

                /* and finally take each layer of each res of ... */
                for (layno = layno0; layno < p_pocs->layno1 ; ++layno) {
                    /*index = step_r * resno + step_c * compno + step_l * layno;*/
                    packet_array[comp_index] = 1;
                    comp_index += step_l;
                }

                res_index += step_c;
            }

            index += step_r;
        }

        ++p_pocs;
    }

    index = 0;
    for (layno = 0; layno < p_num_layers ; ++layno) {
        for (resno = 0; resno < p_nb_resolutions; ++resno) {
            for (compno = 0; compno < p_num_comps; ++compno) {
                loss |= (packet_array[index] != 1);
                /*index = step_r * resno + step_c * compno + step_l * layno;*/
                index += step_c;
            }
        }
    }

    if (loss) {
        opj_event_msg(p_manager, EVT_ERROR, "Missing packets possible loss of data\n");
    }

    opj_free(packet_array);

    return !loss;
}